

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pfm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  CImgArgumentException *this_00;
  char *pcVar9;
  char *pcVar10;
  CImgIOException *pCVar11;
  CImg<unsigned_char> *pCVar12;
  float *pfVar13;
  char *local_240;
  char *local_1f8;
  char *local_1a8;
  FILE *local_158;
  int local_114;
  float *pfStack_110;
  int x_1;
  float *ptrs_1;
  uchar *puStack_100;
  int y_1;
  uchar *ptrd;
  CImg<float> buf_1;
  float *pfStack_d0;
  int x;
  float *ptrs;
  uchar *puStack_c0;
  int y;
  uchar *ptr_b;
  uchar *ptr_g;
  uchar *ptr_r;
  CImg<float> buf;
  bool is_inverted;
  double dStack_80;
  bool is_color;
  double scale;
  int err;
  int H;
  int W;
  CImg<char> item;
  char pfm_type;
  FILE *nfile;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar9 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar9 = "";
    }
    pcVar10 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar9,pcVar10);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_158 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_158 = cimg::fopen(filename,"rb");
  }
  H._3_1_ = 0;
  CImg<char>::CImg((CImg<char> *)&W,0x4000,1,1,1,(char *)((long)&H + 3));
  err = 0;
  scale._4_4_ = 0;
  scale._0_4_ = 0;
  dStack_80 = 0.0;
  while( true ) {
    pcVar9 = CImg<char>::data((CImg<char> *)&W);
    scale._0_4_ = __isoc99_fscanf(local_158,"%16383[^\n]",pcVar9);
    bVar6 = false;
    if (scale._0_4_ != -1) {
      pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&W);
      bVar6 = *pcVar9 == '#' || scale._0_4_ == 0;
    }
    if (!bVar6) break;
    fgetc(local_158);
  }
  pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&W);
  iVar8 = __isoc99_sscanf(pcVar9," P%c",(undefined1 *)((long)&item._data + 7));
  if (iVar8 != 1) {
    if (file == (FILE *)0x0) {
      cimg::fclose(local_158);
    }
    pCVar11 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar9 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar9 = "";
    }
    pcVar10 = pixel_type();
    local_1a8 = filename;
    if (filename == (char *)0x0) {
      local_1a8 = "(FILE*)";
    }
    CImgIOException::CImgIOException
              (pCVar11,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): PFM header not found in file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar9,pcVar10,local_1a8)
    ;
    __cxa_throw(pCVar11,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  while( true ) {
    pcVar9 = CImg<char>::data((CImg<char> *)&W);
    scale._0_4_ = __isoc99_fscanf(local_158," %16383[^\n]",pcVar9);
    bVar6 = false;
    if (scale._0_4_ != -1) {
      pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&W);
      bVar6 = *pcVar9 == '#' || scale._0_4_ == 0;
    }
    if (!bVar6) break;
    fgetc(local_158);
  }
  pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&W);
  scale._0_4_ = __isoc99_sscanf(pcVar9," %d %d",&err,(long)&scale + 4);
  if (scale._0_4_ < 2) {
    if (file == (FILE *)0x0) {
      cimg::fclose(local_158);
    }
    pCVar11 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar9 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar9 = "";
    }
    pcVar10 = pixel_type();
    local_1f8 = filename;
    if (filename == (char *)0x0) {
      local_1f8 = "(FILE*)";
    }
    CImgIOException::CImgIOException
              (pCVar11,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): WIDTH and HEIGHT fields are undefined in file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar9,pcVar10,local_1f8)
    ;
    __cxa_throw(pCVar11,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  if (scale._0_4_ == 2) {
    scale._0_4_ = 2;
    while( true ) {
      pcVar9 = CImg<char>::data((CImg<char> *)&W);
      scale._0_4_ = __isoc99_fscanf(local_158," %16383[^\n]",pcVar9);
      bVar6 = false;
      if (scale._0_4_ != -1) {
        pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&W);
        bVar6 = *pcVar9 == '#' || scale._0_4_ == 0;
      }
      if (!bVar6) break;
      fgetc(local_158);
    }
    pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&W);
    iVar8 = __isoc99_sscanf(pcVar9,"%lf",&stack0xffffffffffffff80);
    if (iVar8 != 1) {
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar5 = this->_data;
      pcVar9 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar9 = "";
      }
      pcVar10 = pixel_type();
      local_240 = filename;
      if (filename == (char *)0x0) {
        local_240 = "(FILE*)";
      }
      cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pfm(): SCALE field is undefined in file \'%s\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar9,pcVar10,
                 local_240);
    }
  }
  fgetc(local_158);
  buf._data._7_1_ = item._data._7_1_ == 'F';
  bVar6 = 0.0 < dStack_80;
  bVar7 = cimg::endianness();
  buf._data._6_1_ = bVar6 != bVar7;
  if ((buf._data._7_1_ & 1) == 0) {
    buf_1._data._3_1_ = 0;
    assign(this,err,scale._4_4_,1,1,(uchar *)((long)&buf_1._data + 3));
    CImg<float>::CImg((CImg<float> *)&ptrd,err,1,1,1);
    puStack_100 = data(this,0,0,0,0);
    for (ptrs_1._4_4_ = 0; ptrs_1._4_4_ < (int)this->_height; ptrs_1._4_4_ = ptrs_1._4_4_ + 1) {
      cimg::fread<float>((float *)buf_1._16_8_,(long)err,(FILE *)local_158);
      if ((buf._data._6_1_ & 1) != 0) {
        cimg::invert_endianness<float>((float *)buf_1._16_8_,(long)err);
      }
      pfStack_110 = (float *)buf_1._16_8_;
      for (local_114 = 0; local_114 < (int)this->_width; local_114 = local_114 + 1) {
        *puStack_100 = (uchar)(int)*pfStack_110;
        pfStack_110 = pfStack_110 + 1;
        puStack_100 = puStack_100 + 1;
      }
    }
    CImg<float>::~CImg((CImg<float> *)&ptrd);
  }
  else {
    buf._data._5_1_ = 0;
    assign(this,err,scale._4_4_,1,3,(uchar *)((long)&buf._data + 5));
    CImg<float>::CImg((CImg<float> *)&ptr_r,err * 3,1,1,1);
    ptr_g = data(this,0,0,0,0);
    ptr_b = data(this,0,0,0,1);
    puStack_c0 = data(this,0,0,0,2);
    for (ptrs._4_4_ = 0; ptrs._4_4_ < (int)this->_height; ptrs._4_4_ = ptrs._4_4_ + 1) {
      cimg::fread<float>((float *)buf._16_8_,(long)(err * 3),(FILE *)local_158);
      if ((buf._data._6_1_ & 1) != 0) {
        cimg::invert_endianness<float>((float *)buf._16_8_,(long)(err * 3));
      }
      pfStack_d0 = (float *)buf._16_8_;
      for (buf_1._data._4_4_ = 0; buf_1._data._4_4_ < (int)this->_width;
          buf_1._data._4_4_ = buf_1._data._4_4_ + 1) {
        *ptr_g = (uchar)(int)*pfStack_d0;
        pfVar13 = pfStack_d0 + 2;
        *ptr_b = (uchar)(int)pfStack_d0[1];
        pfStack_d0 = pfStack_d0 + 3;
        *puStack_c0 = (uchar)(int)*pfVar13;
        puStack_c0 = puStack_c0 + 1;
        ptr_b = ptr_b + 1;
        ptr_g = ptr_g + 1;
      }
    }
    CImg<float>::~CImg((CImg<float> *)&ptr_r);
  }
  if (file == (FILE *)0x0) {
    cimg::fclose(local_158);
  }
  pCVar12 = mirror(this,'y');
  CImg<char>::~CImg((CImg<char> *)&W);
  return pCVar12;
}

Assistant:

CImg<T>& _load_pfm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pfm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      char pfm_type;
      CImg<charT> item(16384,1,1,1,0);
      int W = 0, H = 0, err = 0;
      double scale = 0;
      while ((err=std::fscanf(nfile,"%16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if (cimg_sscanf(item," P%c",&pfm_type)!=1) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pfm(): PFM header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if ((err=cimg_sscanf(item," %d %d",&W,&H))<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pfm(): WIDTH and HEIGHT fields are undefined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (err==2) {
        while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
        if (cimg_sscanf(item,"%lf",&scale)!=1)
          cimg::warn(_cimg_instance
                     "load_pfm(): SCALE field is undefined in file '%s'.",
                     cimg_instance,
                     filename?filename:"(FILE*)");
      }
      std::fgetc(nfile);
      const bool is_color = (pfm_type=='F'), is_inverted = (scale>0)!=cimg::endianness();
      if (is_color) {
        assign(W,H,1,3,0);
        CImg<floatT> buf(3*W);
        T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        cimg_forY(*this,y) {
          cimg::fread(buf._data,3*W,nfile);
          if (is_inverted) cimg::invert_endianness(buf._data,3*W);
          const float *ptrs = buf._data;
          cimg_forX(*this,x) {
            *(ptr_r++) = (T)*(ptrs++);
            *(ptr_g++) = (T)*(ptrs++);
            *(ptr_b++) = (T)*(ptrs++);
          }
        }
      } else {
        assign(W,H,1,1,0);
        CImg<floatT> buf(W);
        T *ptrd = data(0,0,0,0);
        cimg_forY(*this,y) {
          cimg::fread(buf._data,W,nfile);
          if (is_inverted) cimg::invert_endianness(buf._data,W);
          const float *ptrs = buf._data;
          cimg_forX(*this,x) *(ptrd++) = (T)*(ptrs++);
        }
      }
      if (!file) cimg::fclose(nfile);
      return mirror('y');  // Most of the .pfm files are flipped along the y-axis.
    }